

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmd5stream.cpp
# Opt level: O2

void __thiscall TPZMD5Stream::Writes<TFad<1,double>>(TPZMD5Stream *this,TFad<1,_double> *p,int size)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Enable -DUSING_OPENSSL to use the TPZMD5Stream class.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void  TPZMD5Stream::Writes(const T *p, int size) {
#ifdef USING_OPENSSL
  if (last_status == 1)
    last_status = MD5_Update(md5_sig.operator->(), (const void*) p, sizeof(T)*size);
#else
  std::cerr << "Enable -DUSING_OPENSSL to use the TPZMD5Stream class." << std::endl;
#endif
}